

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

item<mpt::layout::graph::data> * __thiscall
mpt::item_array<mpt::layout::graph::data>::append
          (item_array<mpt::layout::graph::data> *this,data *t,char *id,int len)

{
  bool bVar1;
  long pos_00;
  long pos;
  item<mpt::layout::graph::data> *it;
  int len_local;
  char *id_local;
  data *t_local;
  item_array<mpt::layout::graph::data> *this_local;
  
  pos_00 = unique_array<mpt::item<mpt::layout::graph::data>_>::length
                     (&this->super_unique_array<mpt::item<mpt::layout::graph::data>_>);
  this_local = (item_array<mpt::layout::graph::data> *)
               unique_array<mpt::item<mpt::layout::graph::data>_>::insert
                         (&this->super_unique_array<mpt::item<mpt::layout::graph::data>_>,pos_00);
  if ((item<mpt::layout::graph::data> *)this_local == (item<mpt::layout::graph::data> *)0x0) {
    this_local = (item_array<mpt::layout::graph::data> *)0x0;
  }
  else {
    if ((id != (char *)0x0) &&
       (bVar1 = identifier::set_name
                          (&((item<mpt::layout::graph::data> *)this_local)->super_identifier,id,len)
       , !bVar1)) {
      unique_array<mpt::item<mpt::layout::graph::data>_>::resize
                (&this->super_unique_array<mpt::item<mpt::layout::graph::data>_>,pos_00);
      return (item<mpt::layout::graph::data> *)0x0;
    }
    reference<mpt::layout::graph::data>::set_instance
              ((reference<mpt::layout::graph::data> *)this_local,t);
  }
  return (item<mpt::layout::graph::data> *)this_local;
}

Assistant:

inline ~reference()
	{
		if (_ref) _ref->unref();
	}